

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

float ComputeNextQ(PassStats *s)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  dVar1 = s->value;
  if (s->is_first == 0) {
    dVar2 = s->last_value;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      fVar4 = (float)((double)(s->last_q - s->q) * ((s->target - dVar1) / (dVar2 - dVar1)));
    }
    else {
      fVar4 = 0.0;
    }
  }
  else {
    fVar4 = s->dq;
    if (s->target <= dVar1 && dVar1 != s->target) {
      fVar4 = -fVar4;
    }
    s->is_first = 0;
  }
  fVar5 = 30.0;
  if (fVar4 <= 30.0) {
    fVar5 = fVar4;
  }
  fVar4 = (float)(-(uint)(fVar4 < -30.0) & 0xc1f00000 | ~-(uint)(fVar4 < -30.0) & (uint)fVar5);
  s->dq = fVar4;
  s->last_q = s->q;
  s->last_value = s->value;
  fVar4 = fVar4 + s->q;
  fVar5 = s->qmax;
  if (fVar4 <= s->qmax) {
    fVar5 = fVar4;
  }
  uVar3 = -(uint)(fVar4 < s->qmin);
  fVar4 = (float)(uVar3 & (uint)s->qmin | ~uVar3 & (uint)fVar5);
  s->q = fVar4;
  return fVar4;
}

Assistant:

static float ComputeNextQ(PassStats* const s) {
  float dq;
  if (s->is_first) {
    dq = (s->value > s->target) ? -s->dq : s->dq;
    s->is_first = 0;
  } else if (s->value != s->last_value) {
    const double slope = (s->target - s->value) / (s->last_value - s->value);
    dq = (float)(slope * (s->last_q - s->q));
  } else {
    dq = 0.;  // we're done?!
  }
  // Limit variable to avoid large swings.
  s->dq = Clamp(dq, -30.f, 30.f);
  s->last_q = s->q;
  s->last_value = s->value;
  s->q = Clamp(s->q + s->dq, s->qmin, s->qmax);
  return s->q;
}